

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findClique.cpp
# Opt level: O3

void maxCliqueHelper(CGraphIO *gio,vector<int,_std::allocator<int>_> *U,int sizeOfClique,int *maxClq
                    ,vector<int,_std::allocator<int>_> *max_clique_data_inter)

{
  vector<int,_std::allocator<int>_> *ptrVtx;
  int iVar1;
  pointer piVar2;
  iterator __position;
  vector<int,std::allocator<int>> *this;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  long lVar6;
  ulong uVar7;
  int index;
  vector<int,_std::allocator<int>_> U_new;
  int local_60;
  int local_5c;
  vector<int,_std::allocator<int>_> local_58;
  vector<int,std::allocator<int>> *local_40;
  long local_38;
  
  local_60 = 0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&local_58,
             ((long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000 >> 0x20);
  piVar5 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar4 == piVar5) {
    if (*maxClq < sizeOfClique) {
      *maxClq = sizeOfClique;
      piVar5 = (max_clique_data_inter->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((max_clique_data_inter->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish != piVar5) {
        (max_clique_data_inter->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = piVar5;
      }
    }
  }
  else {
    ptrVtx = &gio->m_vi_Vertices;
    local_38 = (long)sizeOfClique;
    local_5c = sizeOfClique + 1;
    local_40 = (vector<int,std::allocator<int>> *)max_clique_data_inter;
    do {
      iVar3 = *maxClq;
      if ((ulong)(((long)piVar4 - (long)piVar5 >> 2) + local_38) <= (ulong)(long)iVar3) break;
      local_60 = piVar4[-1];
      (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
           piVar4 + -1;
      piVar5 = (ptrVtx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar5[local_60];
      lVar6 = (long)iVar1;
      if (iVar1 < piVar5[(long)local_60 + 1]) {
        do {
          iVar3 = getDegree(ptrVtx,(gio->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar6]);
          if (iVar3 < *maxClq) {
            pruned3 = pruned3 + 1;
          }
          else {
            piVar5 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            piVar4 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            if (piVar4 != piVar5) {
              uVar7 = 0;
              do {
                piVar2 = (gio->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                iVar3 = piVar2[lVar6];
                if (iVar3 == piVar5[uVar7]) {
                  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&local_58,
                               (iterator)
                               local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,piVar2 + lVar6);
                    piVar5 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start;
                    piVar4 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish;
                  }
                  else {
                    *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = iVar3;
                    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 < (ulong)((long)piVar4 - (long)piVar5 >> 2));
            }
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (ptrVtx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[(long)local_60 + 1]);
        iVar3 = *maxClq;
      }
      this = local_40;
      maxCliqueHelper(gio,&local_58,local_5c,maxClq,(vector<int,_std::allocator<int>_> *)local_40);
      if (iVar3 < *maxClq) {
        __position._M_current = *(int **)(this + 8);
        if (__position._M_current == *(int **)(this + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this,__position,&local_60);
        }
        else {
          *__position._M_current = local_60;
          *(int **)(this + 8) = __position._M_current + 1;
        }
      }
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      piVar5 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      piVar4 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
    } while (piVar4 != piVar5);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void maxCliqueHelper( CGraphIO& gio, vector<int>* U, int sizeOfClique, int& maxClq, vector<int>& max_clique_data_inter )
{
	int iPos, index = 0, maxClq_prev;
	vector <int>* ptrVertex = gio.GetVerticesPtr();
	vector <int>* ptrEdge = gio.GetEdgesPtr();
	vector <int> U_new;
   U_new.reserve(gio.GetVertexCount());

	if( U->size() == 0  )
	{
		if( sizeOfClique > maxClq )
		{
			maxClq = sizeOfClique;
         max_clique_data_inter.clear();
		}
		return;
	}

	while( U->size() > 0 )
	{
		//Old Pruning
		if( sizeOfClique + U->size() <= maxClq )
			return;

		index = U->back();
		U->pop_back();

		// Loop over neighbrs of v_index.
		for(int j = (*ptrVertex)[index]; j < (*ptrVertex)[index + 1]; j++ )
			//Pruning 5
			if( getDegree(ptrVertex, (*ptrEdge)[j]) >=  maxClq )
			{
				// Loop over U.
				for(int i = 0; i < U->size(); i++)
				{
					if( (*ptrEdge)[j] == (*U)[i] )
						U_new.push_back( (*ptrEdge)[j]);
				}
			}
			else
				pruned3++;

      maxClq_prev = maxClq;

      maxCliqueHelper( gio, &U_new, sizeOfClique + 1, maxClq, max_clique_data_inter );

      if(maxClq > maxClq_prev)
         max_clique_data_inter.push_back(index);

		U_new.clear();
	}
}